

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  ostringstream *this;
  bool bVar1;
  qpTestResult qVar2;
  ResultCollector result;
  QueriedState state;
  long *local_3d0;
  long local_3c8;
  long local_3c0 [2];
  ResultCollector local_3b0;
  QueriedState local_360;
  Enum<int,_2UL> local_338;
  undefined1 local_328 [120];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  gls::StateQueryUtil::QueriedState::QueriedState(&local_360);
  local_328._16_7_ = 0x525245202f2f20;
  local_328._23_4_ = 0x203a524f;
  local_328._8_8_ = 0xb;
  local_328[0x1b] = '\0';
  local_328._0_8_ = local_328 + 0x10;
  tcu::ResultCollector::ResultCollector(&local_3b0,gl->m_log,(string *)local_328);
  if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,CONCAT17(local_328[0x17],local_328._16_7_) + 1);
  }
  local_328._0_8_ = gl->m_log;
  this = (ostringstream *)(local_328 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Verifying ",10);
  local_338.m_getName = glu::getTextureLevelParameterName;
  local_338.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_338,(ostream *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", expecting ",0xc);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::operator<<(local_1a8,refValue);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)local_3d0,local_3c8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0,local_3c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_2b0);
  gls::StateQueryUtil::queryTextureLevelState(&local_3b0,gl,type,target,level,pname,&local_360);
  bVar1 = gls::StateQueryUtil::QueriedState::isUndefined(&local_360);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    gls::StateQueryUtil::verifyInteger(&local_3b0,&local_360,refValue);
    qVar2 = tcu::ResultCollector::getResult(&local_3b0);
    bVar1 = qVar2 == QP_TEST_RESULT_PASS;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_message._M_dataplus._M_p != &local_3b0.m_message.field_2) {
    operator_delete(local_3b0.m_message._M_dataplus._M_p,
                    local_3b0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_prefix._M_dataplus._M_p != &local_3b0.m_prefix.field_2) {
    operator_delete(local_3b0.m_prefix._M_dataplus._M_p,
                    local_3b0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	return verifyTextureLevelParameterEqualWithPrinter<IntegerPrinter>(gl, target, level, pname, refValue, type);
}